

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAtomic.h
# Opt level: O0

deInt64 deAtomicIncrementInt64(deInt64 *dstAddr)

{
  long lVar1;
  deInt64 *dstAddr_local;
  
  LOCK();
  lVar1 = *dstAddr;
  *dstAddr = *dstAddr + 1;
  UNLOCK();
  return lVar1 + 1;
}

Assistant:

DE_INLINE deInt64 deAtomicIncrementInt64 (volatile deInt64* dstAddr)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	return _InterlockedIncrement64((volatile long long*)dstAddr);
#elif (DE_COMPILER == DE_COMPILER_GCC) || (DE_COMPILER == DE_COMPILER_CLANG)
	return __sync_add_and_fetch(dstAddr, 1);
#else
#	error "Implement deAtomicIncrementInt64()"
#endif
}